

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O3

void __thiscall
Diligent::ShaderResourceCacheVk::InitializeSets
          (ShaderResourceCacheVk *this,IMemoryAllocator *MemAllocator,Uint32 NumSets,
          Uint32 *SetSizes)

{
  void *ptr;
  _Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false> _Var1;
  uint uVar2;
  int iVar3;
  IMemoryAllocator *pIVar4;
  undefined4 extraout_var;
  DescriptorSet *pDVar6;
  unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *Args_1;
  char (*Args_1_00) [58];
  Uint32 UVar7;
  Resource *pRVar8;
  char *pcVar9;
  _Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false> _Var10;
  long lVar11;
  Uint32 UVar12;
  uint uVar13;
  char (*in_R8) [37];
  Resource *pRVar14;
  ulong uVar15;
  string msg;
  Uint32 local_64;
  string local_60;
  _Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false> local_40;
  unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *local_38;
  void *pvVar5;
  
  local_64 = NumSets;
  if ((this->m_pMemory)._M_t.
      super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
      super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
      super__Head_base<0UL,_void_*,_false>._M_head_impl != (void *)0x0) {
    FormatString<char[34]>(&local_60,(char (*) [34])"Memory has already been allocated");
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"InitializeSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x37);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  this->m_NumSets = (Uint16)local_64;
  if (0xffff < local_64) {
    FormatString<char[10],unsigned_int,char[37]>
              (&local_60,(Diligent *)"NumSets (",(char (*) [10])&local_64,
               (uint *)") exceed maximum representable value",in_R8);
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"InitializeSets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x44);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2 = *(uint *)&this->field_0x1c & 0x80000000;
  *(uint *)&this->field_0x1c = uVar2;
  if (local_64 == 0) {
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::resize(&this->m_DbgInitializedResources,(ulong)this->m_NumSets);
  }
  else {
    Args_1 = &this->m_pMemory;
    pcVar9 = (char *)0x0;
    UVar7 = local_64;
    local_40._M_head_impl.m_Allocator =
         (STDDeleter<void,_Diligent::IMemoryAllocator>)
         (STDDeleter<void,_Diligent::IMemoryAllocator>)MemAllocator;
    local_38 = Args_1;
    do {
      UVar12 = SetSizes[(long)pcVar9];
      if (UVar12 == 0) {
        FormatString<char[26],char[16]>
                  (&local_60,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"SetSizes[t] > 0",(char (*) [16])Args_1);
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"InitializeSets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                   ,0x49);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        UVar12 = SetSizes[(long)pcVar9];
        uVar2 = *(uint *)&this->field_0x1c;
        UVar7 = local_64;
      }
      _Var1._M_head_impl.m_Allocator = local_40._M_head_impl.m_Allocator;
      uVar13 = UVar12 + uVar2 & 0x7fffffff;
      uVar2 = uVar2 & 0x80000000 | uVar13;
      *(uint *)&this->field_0x1c = uVar2;
      pcVar9 = pcVar9 + 1;
      Args_1 = (unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_> *)
               (ulong)UVar7;
    } while (pcVar9 < Args_1);
    _Var10._M_head_impl.m_Allocator =
         (STDDeleter<void,_Diligent::IMemoryAllocator>)((ulong)uVar13 * 0x20 + (long)Args_1 * 0x30);
    pIVar4 = (IMemoryAllocator *)0x0;
    if (UVar7 != 0) {
      pcVar9 = (char *)0x0;
      do {
        uVar2 = (int)pIVar4 + SetSizes[(long)pcVar9];
        pIVar4 = (IMemoryAllocator *)(ulong)uVar2;
        pcVar9 = pcVar9 + 1;
      } while (Args_1 != (unique_ptr<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                          *)pcVar9);
      pIVar4 = (IMemoryAllocator *)((ulong)uVar2 * 0x20 + (long)Args_1 * 0x30);
    }
    if (_Var10._M_head_impl.m_Allocator != (STDDeleter<void,_Diligent::IMemoryAllocator>)pIVar4) {
      FormatString<char[26],char[55]>
                (&local_60,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"MemorySize == GetRequiredMemorySize(NumSets, SetSizes)",
                 (char (*) [55])Args_1);
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"InitializeSets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                 ,0x4e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::resize(&this->m_DbgInitializedResources,(ulong)this->m_NumSets);
    if (_Var10._M_head_impl.m_Allocator != (IMemoryAllocator *)0x0) {
      iVar3 = (***(_func_int ***)_Var1._M_head_impl.m_Allocator)
                        (_Var1._M_head_impl.m_Allocator,_Var10._M_head_impl.m_Allocator,
                         "Memory for shader resource cache data",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                         ,0x55);
      pvVar5 = (void *)CONCAT44(extraout_var,iVar3);
      ptr = (this->m_pMemory)._M_t.
            super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
            _M_t.
            super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
            super__Head_base<0UL,_void_*,_false>._M_head_impl;
      (this->m_pMemory)._M_t.
      super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
      super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
      super__Head_base<0UL,_void_*,_false>._M_head_impl = pvVar5;
      if (ptr == (void *)0x0) {
        (local_38->_M_t).
        super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
        super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
        super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
        super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>.
        _M_head_impl = _Var1._M_head_impl.m_Allocator;
      }
      else {
        STDDeleter<void,_Diligent::IMemoryAllocator>::operator()
                  ((STDDeleter<void,_Diligent::IMemoryAllocator> *)local_38,ptr);
        (this->m_pMemory)._M_t.
        super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
        super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
        super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
        super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>.
        _M_head_impl = _Var1._M_head_impl.m_Allocator;
        pvVar5 = (this->m_pMemory)._M_t.
                 super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                 .super__Head_base<0UL,_void_*,_false>._M_head_impl;
      }
      Args_1_00 = (char (*) [58])(ulong)this->m_NumSets;
      pRVar14 = (Resource *)((ulong)((uint)this->m_NumSets * 0x30) + (long)pvVar5);
      if (local_64 != 0) {
        lVar11 = 0;
        uVar15 = 0;
        local_40._M_head_impl.m_Allocator = _Var10._M_head_impl.m_Allocator;
        do {
          pDVar6 = GetDescriptorSet(this,(Uint32)uVar15);
          uVar2 = SetSizes[uVar15];
          Args_1_00 = (char (*) [58])(ulong)uVar2;
          pRVar8 = (Resource *)0x0;
          if (uVar2 != 0) {
            pRVar8 = pRVar14;
          }
          pDVar6->m_NumResources = uVar2;
          pDVar6->m_pResources = pRVar8;
          (pDVar6->m_DescriptorSetAllocation).CmdQueueMask = 0;
          (pDVar6->m_DescriptorSetAllocation).DescrSetAllocator = (DescriptorSetAllocator *)0x0;
          (pDVar6->m_DescriptorSetAllocation).Set = (VkDescriptorSet)0x0;
          (pDVar6->m_DescriptorSetAllocation).Pool = (VkDescriptorPool)0x0;
          pRVar14 = pRVar14 + SetSizes[uVar15];
          std::vector<bool,_std::allocator<bool>_>::resize
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->m_DbgInitializedResources).
                               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar11),(ulong)SetSizes[uVar15],false);
          uVar15 = uVar15 + 1;
          lVar11 = lVar11 + 0x28;
        } while (uVar15 < local_64);
        pvVar5 = (this->m_pMemory)._M_t.
                 super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>
                 .super__Head_base<0UL,_void_*,_false>._M_head_impl;
        _Var10._M_head_impl.m_Allocator =
             (STDDeleter<void,_Diligent::IMemoryAllocator>)
             (STDDeleter<void,_Diligent::IMemoryAllocator>)local_40;
      }
      if (pRVar14 != (Resource *)((long)pvVar5 + (long)_Var10._M_head_impl.m_Allocator)) {
        FormatString<char[26],char[58]>
                  (&local_60,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"(char*)pCurrResPtr == (char*)m_pMemory.get() + MemorySize",
                   Args_1_00);
        DebugAssertionFailed
                  (local_60._M_dataplus._M_p,"InitializeSets",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
                   ,99);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void ShaderResourceCacheVk::InitializeSets(IMemoryAllocator& MemAllocator, Uint32 NumSets, const Uint32* SetSizes)
{
    VERIFY(!m_pMemory, "Memory has already been allocated");

    // Memory layout:
    //
    //  m_pMemory
    //  |
    //  V
    // ||  DescriptorSet[0]  |   ....    |  DescriptorSet[Ns-1]  |  Res[0]  |  ... |  Res[n-1]  |    ....     | Res[0]  |  ... |  Res[m-1]  ||
    //
    //
    //  Ns = m_NumSets

    m_NumSets = static_cast<Uint16>(NumSets);
    VERIFY(m_NumSets == NumSets, "NumSets (", NumSets, ") exceed maximum representable value");

    m_TotalResources = 0;
    for (Uint32 t = 0; t < NumSets; ++t)
    {
        VERIFY_EXPR(SetSizes[t] > 0);
        m_TotalResources += SetSizes[t];
    }

    const size_t MemorySize = NumSets * sizeof(DescriptorSet) + m_TotalResources * sizeof(Resource);
    VERIFY_EXPR(MemorySize == GetRequiredMemorySize(NumSets, SetSizes));
#ifdef DILIGENT_DEBUG
    m_DbgInitializedResources.resize(m_NumSets);
#endif
    if (MemorySize > 0)
    {
        m_pMemory = decltype(m_pMemory){
            ALLOCATE_RAW(MemAllocator, "Memory for shader resource cache data", MemorySize),
            STDDeleter<void, IMemoryAllocator>(MemAllocator) //
        };

        DescriptorSet* pSets       = reinterpret_cast<DescriptorSet*>(m_pMemory.get());
        Resource*      pCurrResPtr = reinterpret_cast<Resource*>(pSets + m_NumSets);
        for (Uint32 t = 0; t < NumSets; ++t)
        {
            new (&GetDescriptorSet(t)) DescriptorSet{SetSizes[t], SetSizes[t] > 0 ? pCurrResPtr : nullptr};
            pCurrResPtr += SetSizes[t];
#ifdef DILIGENT_DEBUG
            m_DbgInitializedResources[t].resize(SetSizes[t]);
#endif
        }
        VERIFY_EXPR((char*)pCurrResPtr == (char*)m_pMemory.get() + MemorySize);
    }
}